

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

UBool __thiscall icu_63::TimeZone::operator==(TimeZone *this,TimeZone *that)

{
  ushort uVar1;
  short sVar2;
  char *__s1;
  char *__s2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  __s1 = *(char **)((this->super_UObject)._vptr_UObject[-1] + 8);
  __s2 = *(char **)((that->super_UObject)._vptr_UObject[-1] + 8);
  if (__s1 == __s2) {
LAB_0020272b:
    uVar1 = (this->fID).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar4 = (this->fID).fUnion.fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar1 >> 5;
      }
      sVar2 = (that->fID).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar5 = (that->fID).fUnion.fFields.fLength;
      }
      else {
        iVar5 = (int)sVar2 >> 5;
      }
      bVar6 = false;
      if ((((int)sVar2 & 1U) == 0) && (iVar4 == iVar5)) {
        UVar3 = UnicodeString::doEquals(&this->fID,&that->fID,iVar4);
        bVar6 = UVar3 != '\0';
      }
    }
    else {
      bVar6 = (bool)(*(byte *)&(that->fID).fUnion & 1);
    }
  }
  else {
    if (*__s1 != '*') {
      iVar4 = strcmp(__s1,__s2);
      if (iVar4 == 0) goto LAB_0020272b;
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

UBool
TimeZone::operator==(const TimeZone& that) const
{
    return typeid(*this) == typeid(that) &&
        fID == that.fID;
}